

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall kj::anon_unknown_59::InMemoryFile::stat(InMemoryFile *this,char *__file,stat *__buf)

{
  Impl *pIVar1;
  uint64_t hash;
  undefined1 local_20 [8];
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  InMemoryFile *this_local;
  
  lock.ptr = (Impl *)__file;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_20,__file + 0x18);
  *(undefined4 *)&(this->super_File).super_ReadableFile.super_FsNode._vptr_FsNode = 0;
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_20);
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)pIVar1->size;
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_20);
  *(size_t *)&(this->super_AtomicRefcounted).refcount = pIVar1->size;
  pIVar1 = Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::operator->
                     ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_20);
  *(long *)&(this->impl).mutex = (pIVar1->lastModified).value.value;
  *(undefined4 *)&(this->impl).mutex.waitersHead.ptr = 1;
  (this->impl).mutex.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)__file;
  Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl>::~Locked
            ((Locked<const_kj::(anonymous_namespace)::InMemoryFile::Impl> *)local_20);
  return (int)this;
}

Assistant:

Metadata stat() const override {
    auto lock = impl.lockShared();
    uint64_t hash = reinterpret_cast<uintptr_t>(this);
    return Metadata { Type::FILE, lock->size, lock->size, lock->lastModified, 1, hash };
  }